

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

Value * __thiscall
anon_unknown.dwarf_13e8501::Target::DumpCommandFragment
          (Value *__return_storage_ptr__,Target *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *frag
          ,string *role)

{
  Value *pVVar1;
  Value local_70;
  Value local_48;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_48,&frag->Value);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"fragment");
  Json::Value::operator=(pVVar1,&local_48);
  Json::Value::~Value(&local_48);
  if (role->_M_string_length != 0) {
    Json::Value::Value(&local_70,role);
    pVVar1 = Json::Value::operator[](__return_storage_ptr__,"role");
    Json::Value::operator=(pVVar1,&local_70);
    Json::Value::~Value(&local_70);
  }
  AddBacktrace(this,__return_storage_ptr__,&frag->Backtrace);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpCommandFragment(BT<std::string> const& frag,
                                        std::string const& role)
{
  Json::Value fragment = Json::objectValue;
  fragment["fragment"] = frag.Value;
  if (!role.empty()) {
    fragment["role"] = role;
  }
  this->AddBacktrace(fragment, frag.Backtrace);
  return fragment;
}